

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeImportSleep(TranslateToFuzzReader *this,Type type)

{
  string_view target;
  Expression *pEVar1;
  Call *pCVar2;
  initializer_list<wasm::Expression_*> __l;
  Expression *local_60;
  Expression *local_58;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_50;
  allocator_type local_31;
  
  pEVar1 = make(this,(Type)0x2);
  local_58 = make(this,(Type)0x2);
  target = (this->sleepImportName).super_IString.str;
  __l._M_len = 2;
  __l._M_array = &local_60;
  local_60 = pEVar1;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_50,__l,
             &local_31);
  pCVar2 = Builder::makeCall(&this->builder,(Name)target,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &local_50,(Type)0x2,false);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_50);
  return (Expression *)pCVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeImportSleep(Type type) {
  // Sleep for some ms, and return a given id.
  auto* ms = make(Type::i32);
  auto id = make(Type::i32);
  return builder.makeCall(sleepImportName, {ms, id}, Type::i32);
}